

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FileStdio.cpp
# Opt level: O1

void __thiscall
adios2::transport::FileStdio::OpenChain
          (FileStdio *this,string *name,Mode openMode,Comm *chainComm,bool async,bool directio)

{
  size_type sVar1;
  _Alloc_hider _Var2;
  int iVar3;
  int iVar4;
  _State_baseV2 *__tmp;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var5;
  _Result<_IO_FILE_*> *p_Var6;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var7;
  int *piVar8;
  FILE *pFVar9;
  long *plVar10;
  size_type *psVar11;
  _State_baseV2 *__tmp_1;
  FileStdio *__rhs;
  char *__modes;
  pointer pcVar12;
  bool bVar13;
  shared_ptr<std::__future_base::_State_baseV2> __state;
  int token;
  string local_e8;
  int local_c4;
  FileStdio *local_c0;
  string local_b8;
  string local_98;
  Comm local_78;
  string local_70;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50;
  
  local_c4 = 1;
  __rhs = (FileStdio *)&(this->super_Transport).m_Name;
  std::__cxx11::string::_M_assign((string *)__rhs);
  (*(this->super_Transport)._vptr_Transport[0x13])(this);
  iVar3 = helper::Comm::Rank(chainComm);
  if (0 < iVar3) {
    local_c0 = this;
    iVar3 = helper::Comm::Rank(chainComm);
    local_e8._M_dataplus._M_p = (pointer)&local_e8.field_2;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_e8,"Chain token in FileStdio::OpenChain","");
    helper::Comm::Recv<int>((Status *)&local_b8,chainComm,&local_c4,1,iVar3 + -1,0,&local_e8);
    this = local_c0;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_e8._M_dataplus._M_p != &local_e8.field_2) {
      operator_delete(local_e8._M_dataplus._M_p);
      this = local_c0;
    }
  }
  (this->super_Transport).m_OpenMode = openMode;
  if (openMode == Append) {
    piVar8 = __errno_location();
    *piVar8 = 0;
    pFVar9 = fopen((name->_M_dataplus)._M_p,"rwb");
    this->m_File = (FILE *)pFVar9;
    fseek(pFVar9,0,2);
    goto LAB_006429ad;
  }
  if (openMode == Read) {
    piVar8 = __errno_location();
    *piVar8 = 0;
    pcVar12 = (name->_M_dataplus)._M_p;
    __modes = "rb";
  }
  else {
    if (openMode != Write) {
      local_e8._M_dataplus._M_p = (pointer)&local_e8.field_2;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_e8,"Toolkit","");
      local_b8._M_dataplus._M_p = (pointer)&local_b8.field_2;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_b8,"transport::file::FileStdio","");
      local_98._M_dataplus._M_p = (pointer)&local_98.field_2;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_98,"Open","");
      std::operator+(&local_50,"unknown open mode for file ",
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)__rhs);
      helper::Throw<std::ios_base::failure[abi:cxx11]>(&local_e8,&local_b8,&local_98,&local_50,-1);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_50._M_dataplus._M_p != &local_50.field_2) {
        operator_delete(local_50._M_dataplus._M_p);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_98._M_dataplus._M_p != &local_98.field_2) {
        operator_delete(local_98._M_dataplus._M_p);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_b8._M_dataplus._M_p != &local_b8.field_2) {
        operator_delete(local_b8._M_dataplus._M_p);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_e8._M_dataplus._M_p != &local_e8.field_2) {
        operator_delete(local_e8._M_dataplus._M_p);
      }
      goto LAB_006429ad;
    }
    if (async) {
      this->m_IsOpening = true;
      local_e8._M_dataplus._M_p = (pointer)0x0;
      local_e8._M_string_length = 0;
      p_Var5 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)operator_new(0x68);
      p_Var5->_M_use_count = 1;
      p_Var5->_M_weak_count = 1;
      p_Var5->_vptr__Sp_counted_base = (_func_int **)&PTR___Sp_counted_ptr_inplace_008854b0;
      p_Var7 = p_Var5 + 1;
      p_Var5[2]._M_use_count = 0;
      p_Var5[1]._M_use_count = 0;
      p_Var5[1]._M_weak_count = 0;
      *(undefined8 *)((long)&p_Var5[1]._M_weak_count + 1) = 0;
      p_Var5[3]._vptr__Sp_counted_base = (_func_int **)0x0;
      p_Var5[3]._M_use_count = 0;
      p_Var5[1]._vptr__Sp_counted_base = (_func_int **)&PTR___Async_state_impl_00885500;
      local_c0 = __rhs;
      p_Var6 = (_Result<_IO_FILE_*> *)operator_new(0x20);
      std::__future_base::_Result<_IO_FILE_*>::_Result(p_Var6);
      p_Var5[4]._vptr__Sp_counted_base = (_func_int **)p_Var6;
      *(_Atomic_word **)&p_Var5[4]._M_use_count = &p_Var5[5]._M_use_count;
      pcVar12 = (name->_M_dataplus)._M_p;
      std::__cxx11::string::_M_construct<char*>
                ((string *)&p_Var5[4]._M_use_count,pcVar12,pcVar12 + name->_M_string_length);
      local_b8._M_dataplus._M_p = (pointer)0x0;
      local_98._M_dataplus._M_p = (pointer)operator_new(0x20);
      *(undefined ***)local_98._M_dataplus._M_p = &PTR___State_00885558;
      *(_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> **)((long)local_98._M_dataplus._M_p + 8) =
           p_Var7;
      *(code **)((long)local_98._M_dataplus._M_p + 0x10) =
           std::__future_base::
           _Async_state_impl<std::thread::_Invoker<std::tuple<(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/ornladios[P]ADIOS2/source/adios2/toolkit/transport/file/FileStdio.cpp:109:30),_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,__IO_FILE_*>
           ::_M_run;
      *(size_type *)((long)local_98._M_dataplus._M_p + 0x18) = 0;
      std::thread::_M_start_thread(&local_b8,&local_98,0);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_98._M_dataplus._M_p !=
          (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)0x0) {
        (**(code **)(*(size_type *)local_98._M_dataplus._M_p + 8))();
      }
      __rhs = local_c0;
      sVar1 = local_e8._M_string_length;
      if (p_Var5[3]._vptr__Sp_counted_base != (_func_int **)0x0) {
        std::terminate();
      }
      p_Var5[3]._vptr__Sp_counted_base = (_func_int **)local_b8._M_dataplus._M_p;
      bVar13 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_e8._M_string_length !=
               (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
      local_e8._M_dataplus._M_p = (pointer)p_Var7;
      local_e8._M_string_length = (size_type)p_Var5;
      if (bVar13) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                  ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)sVar1);
      }
      if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_e8._M_dataplus._M_p ==
          (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        p_Var7 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)operator_new(0x58);
        p_Var7->_M_use_count = 1;
        p_Var7->_M_weak_count = 1;
        p_Var7->_vptr__Sp_counted_base = (_func_int **)&PTR___Sp_counted_ptr_inplace_00885598;
        p_Var7[2]._M_use_count = 0;
        p_Var7[1]._M_use_count = 0;
        p_Var7[1]._M_weak_count = 0;
        *(undefined8 *)((long)&p_Var7[1]._M_weak_count + 1) = 0;
        p_Var7[1]._vptr__Sp_counted_base = (_func_int **)&PTR___Deferred_state_008855e8;
        p_Var6 = (_Result<_IO_FILE_*> *)operator_new(0x20);
        std::__future_base::_Result<_IO_FILE_*>::_Result(p_Var6);
        p_Var7[3]._vptr__Sp_counted_base = (_func_int **)p_Var6;
        *(_Atomic_word **)&p_Var7[3]._M_use_count = &p_Var7[4]._M_use_count;
        pcVar12 = (name->_M_dataplus)._M_p;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)&p_Var7[3]._M_use_count,pcVar12,pcVar12 + name->_M_string_length);
        __rhs = local_c0;
        sVar1 = local_e8._M_string_length;
        bVar13 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_e8._M_string_length !=
                 (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
        local_e8._M_dataplus._M_p = (pointer)(p_Var7 + 1);
        local_e8._M_string_length = (size_type)p_Var7;
        if (bVar13) {
          std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                    ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)sVar1);
        }
      }
      std::__basic_future<_IO_FILE_*>::__basic_future
                ((__basic_future<_IO_FILE_*> *)&local_b8,(__state_type *)&local_e8);
      if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_e8._M_string_length !=
          (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                  ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_e8._M_string_length);
      }
      sVar1 = local_b8._M_string_length;
      _Var2._M_p = local_b8._M_dataplus._M_p;
      local_b8._M_dataplus._M_p = (pointer)0x0;
      local_b8._M_string_length = 0;
      p_Var7 = (this->m_OpenFuture).super___basic_future<_IO_FILE_*>._M_state.
               super___shared_ptr<std::__future_base::_State_baseV2,_(__gnu_cxx::_Lock_policy)2>.
               _M_refcount._M_pi;
      (this->m_OpenFuture).super___basic_future<_IO_FILE_*>._M_state.
      super___shared_ptr<std::__future_base::_State_baseV2,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
           (element_type *)_Var2._M_p;
      (this->m_OpenFuture).super___basic_future<_IO_FILE_*>._M_state.
      super___shared_ptr<std::__future_base::_State_baseV2,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
      _M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)sVar1;
      if (p_Var7 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var7);
      }
      if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_b8._M_string_length !=
          (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                  ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_b8._M_string_length);
      }
      goto LAB_006429ad;
    }
    piVar8 = __errno_location();
    *piVar8 = 0;
    pcVar12 = (name->_M_dataplus)._M_p;
    __modes = "wb";
  }
  pFVar9 = fopen(pcVar12,__modes);
  this->m_File = (FILE *)pFVar9;
LAB_006429ad:
  if (this->m_IsOpening == false) {
    std::operator+(&local_e8,"couldn\'t open file ",
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)__rhs);
    plVar10 = (long *)std::__cxx11::string::append((char *)&local_e8);
    psVar11 = (size_type *)(plVar10 + 2);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)*plVar10 ==
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)psVar11) {
      local_70.field_2._M_allocated_capacity = *psVar11;
      local_70.field_2._8_8_ = plVar10[3];
      local_70._M_dataplus._M_p = (pointer)&local_70.field_2;
    }
    else {
      local_70.field_2._M_allocated_capacity = *psVar11;
      local_70._M_dataplus._M_p = (pointer)*plVar10;
    }
    local_70._M_string_length = plVar10[1];
    *plVar10 = (long)psVar11;
    plVar10[1] = 0;
    *(undefined1 *)(plVar10 + 2) = 0;
    CheckFile(this,&local_70);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_70._M_dataplus._M_p != &local_70.field_2) {
      operator_delete(local_70._M_dataplus._M_p);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_e8._M_dataplus._M_p != &local_e8.field_2) {
      operator_delete(local_e8._M_dataplus._M_p);
    }
    (this->super_Transport).m_IsOpen = true;
  }
  iVar3 = helper::Comm::Rank(chainComm);
  iVar4 = helper::Comm::Size(chainComm);
  if (iVar3 < iVar4 + -1) {
    iVar3 = helper::Comm::Rank(chainComm);
    local_e8._M_dataplus._M_p = (pointer)&local_e8.field_2;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_e8,"Sending Chain token in FileStdio::OpenChain","");
    helper::Comm::Isend<int>(&local_78,(int *)chainComm,(size_t)&local_c4,1,iVar3 + 1,(string *)0x0)
    ;
    helper::Comm::Req::~Req((Req *)&local_78);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_e8._M_dataplus._M_p != &local_e8.field_2) {
      operator_delete(local_e8._M_dataplus._M_p);
    }
  }
  return;
}

Assistant:

void FileStdio::OpenChain(const std::string &name, Mode openMode, const helper::Comm &chainComm,
                          const bool async, const bool directio)
{
    auto lf_AsyncOpenWrite = [&](const std::string &name) -> FILE * {
        errno = 0;
        return std::fopen(name.c_str(), "wb");
    };

    int token = 1;
    m_Name = name;
    CheckName();

    if (chainComm.Rank() > 0)
    {
        chainComm.Recv(&token, 1, chainComm.Rank() - 1, 0, "Chain token in FileStdio::OpenChain");
    }

    m_OpenMode = openMode;
    switch (m_OpenMode)
    {
    case Mode::Write:
        if (async)
        {
            m_IsOpening = true;
            m_OpenFuture = std::async(std::launch::async, lf_AsyncOpenWrite, name);
        }
        else
        {
            errno = 0;
            m_File = std::fopen(name.c_str(), "wb");
        }
        break;
    case Mode::Append:
        errno = 0;
        m_File = std::fopen(name.c_str(), "rwb");
        std::fseek(m_File, 0, SEEK_END);
        break;
    case Mode::Read:
        errno = 0;
        m_File = std::fopen(name.c_str(), "rb");
        break;
    default:
        helper::Throw<std::ios_base::failure>("Toolkit", "transport::file::FileStdio", "Open",
                                              "unknown open mode for file " + m_Name);
    }

    if (!m_IsOpening)
    {
        CheckFile("couldn't open file " + m_Name +
                  ", check permissions or path existence, in call to stdio open");
        m_IsOpen = true;
    }

    if (chainComm.Rank() < chainComm.Size() - 1)
    {
        chainComm.Isend(&token, 1, chainComm.Rank() + 1, 0,
                        "Sending Chain token in FileStdio::OpenChain");
    }
}